

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

int Prs_ManUtilSkipComments(Prs_Man_t *p)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = p->pCur;
  iVar2 = 0;
  if (*pcVar4 == '/') {
    if (pcVar4[1] == '*') {
      for (pcVar4 = pcVar4 + 2; p->pCur = pcVar4, pcVar4 < p->pLimit; pcVar4 = pcVar4 + 1) {
        if ((*pcVar4 == '*') && (pcVar4[1] == '/')) {
          pcVar4 = pcVar4 + 2;
          goto LAB_0035a355;
        }
      }
    }
    else if (pcVar4[1] == '/') {
      pcVar3 = pcVar4 + 2;
      do {
        p->pCur = pcVar3;
        if (p->pLimit <= pcVar3) {
          return 0;
        }
        pcVar4 = pcVar3 + 1;
        cVar1 = *pcVar3;
        pcVar3 = pcVar4;
      } while (cVar1 != '\n');
LAB_0035a355:
      p->pCur = pcVar4;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static inline int Prs_ManUtilSkipComments( Prs_Man_t * p )
{
    if ( !Prs_ManIsChar(p, '/') )
        return 0;
    if ( Prs_ManIsChar1(p, '/') )
    {
        for ( p->pCur += 2; p->pCur < p->pLimit; p->pCur++ )
            if ( Prs_ManIsChar(p, '\n') )
                { p->pCur++; return 1; }
    }
    else if ( Prs_ManIsChar1(p, '*') )
    {
        for ( p->pCur += 2; p->pCur < p->pLimit; p->pCur++ )
            if ( Prs_ManIsChar(p, '*') && Prs_ManIsChar1(p, '/') )
                { p->pCur++; p->pCur++; return 1; }
    }
    return 0;
}